

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddTargetObject(cmMakefile *this,string *tgtName,string *objFile)

{
  cmSourceFile *this_00;
  reference this_01;
  string *name;
  allocator<char> local_49;
  string local_48;
  cmSourceFile *local_28;
  cmSourceFile *sf;
  string *objFile_local;
  string *tgtName_local;
  cmMakefile *this_local;
  
  sf = (cmSourceFile *)objFile;
  objFile_local = tgtName;
  tgtName_local = (string *)this;
  local_28 = GetOrCreateSource(this,objFile,true,Known);
  cmSourceFile::SetObjectLibrary(local_28,objFile_local);
  this_00 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"EXTERNAL_OBJECT",&local_49);
  cmSourceFile::SetProperty(this_00,&local_48,"1");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_01 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::operator[]
                      (&this->SourceGroups,this->ObjectLibrariesSourceGroupIndex);
  name = cmSourceFile::ResolveFullPath(local_28,(string *)0x0,(string *)0x0);
  cmSourceGroup::AddGroupFile(this_01,name);
  return;
}

Assistant:

void cmMakefile::AddTargetObject(std::string const& tgtName,
                                 std::string const& objFile)
{
  cmSourceFile* sf =
    this->GetOrCreateSource(objFile, true, cmSourceFileLocationKind::Known);
  sf->SetObjectLibrary(tgtName);
  sf->SetProperty("EXTERNAL_OBJECT", "1");
#if !defined(CMAKE_BOOTSTRAP)
  this->SourceGroups[this->ObjectLibrariesSourceGroupIndex].AddGroupFile(
    sf->ResolveFullPath());
#endif
}